

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void checkSolutionRational<double>(SoPlexBase<double> *soplex)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  SPxOut *pSVar4;
  SPxOut *o;
  SPxOut *_spxout;
  SoPlexBase<double> *in_RDI;
  Rational *in_stack_00000058;
  Rational *in_stack_00000060;
  SoPlexBase<double> *in_stack_00000068;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  bool feasible_1;
  Rational maxviol_1;
  Verbosity old_verbosity_3;
  Rational sumviol_1;
  Rational dualviol;
  Rational redcostviol;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool feasible;
  Rational maxviol;
  Verbosity old_verbosity;
  Rational sumviol;
  Rational rowviol;
  Rational boundviol;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffc28;
  SPxOut *in_stack_fffffffffffffc30;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffc38;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffc40;
  undefined1 *local_3b0;
  undefined1 *local_378;
  Verbosity local_368;
  Verbosity local_364 [3];
  undefined1 local_358 [64];
  Real local_318;
  undefined1 local_309;
  undefined1 local_308 [72];
  Verbosity local_2c0;
  Verbosity local_2bc;
  undefined1 local_2b8 [64];
  undefined1 local_278 [64];
  undefined1 local_238 [16];
  Rational *in_stack_fffffffffffffdd8;
  Rational *in_stack_fffffffffffffde0;
  SoPlexBase<double> *in_stack_fffffffffffffde8;
  Verbosity local_1f8;
  Verbosity local_1f4 [3];
  undefined1 local_1e8 [64];
  Rational *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  SoPlexBase<double> *in_stack_fffffffffffffe68;
  Verbosity local_150;
  Verbosity local_14c;
  undefined1 local_148 [80];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  SoPlexBase<double> *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_78 = in_RDI;
  bVar1 = ::soplex::SoPlexBase<double>::hasPrimal((SoPlexBase<double> *)0x14b1ec);
  if (bVar1) {
    local_30 = local_b8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b212);
    local_28 = local_f8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b22f);
    local_20 = local_148;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b250);
    bVar1 = ::soplex::SoPlexBase<double>::getBoundViolationRational
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                      );
    if ((bVar1) &&
       (bVar1 = ::soplex::SoPlexBase<double>::getRowViolationRational
                          (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                           in_stack_fffffffffffffdd8), bVar1)) {
      if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
        local_14c = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
        local_150 = INFO1;
        ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_150);
        tVar2 = boost::multiprecision::operator>
                          (in_stack_fffffffffffffc28,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x14b33b);
        if (tVar2) {
          local_378 = local_b8;
        }
        else {
          local_378 = local_f8;
        }
        local_68 = &stack0xfffffffffffffe68;
        local_70 = local_378;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor(in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_backend);
        in_stack_fffffffffffffe58 =
             (Rational *)::soplex::SoPlexBase<double>::realParam(local_78,FEASTOL);
        in_stack_fffffffffffffe67 =
             boost::multiprecision::operator<=
                       (in_stack_fffffffffffffc38,(double *)in_stack_fffffffffffffc30);
        ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        local_58 = local_1e8;
        local_60 = &stack0xfffffffffffffe68;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor(in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_backend);
        ::soplex::operator<<(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14b4b5);
        ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_14c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14b4db);
      }
    }
    else if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
            (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
      local_1f4[2] = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
      local_1f4[1] = 3;
      ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_1f4 + 1);
      ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
      ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_1f4 + 2);
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14b62d);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14b63a);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14b647);
  }
  else if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
          (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
    local_1f4[0] = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
    local_1f8 = INFO1;
    ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_1f8);
    ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_1f4);
  }
  bVar1 = ::soplex::SoPlexBase<double>::hasDual((SoPlexBase<double> *)0x14b728);
  if (bVar1) {
    local_18 = local_238;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b74e);
    local_10 = local_278;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b76b);
    local_8 = local_2b8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x14b78c);
    bVar1 = ::soplex::SoPlexBase<double>::getRedCostViolationRational
                      (in_stack_fffffffffffffe68,
                       (Rational *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
    if ((bVar1) &&
       (bVar1 = ::soplex::SoPlexBase<double>::getDualViolationRational
                          (in_stack_00000068,in_stack_00000060,in_stack_00000058), bVar1)) {
      if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
        local_2bc = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
        local_2c0 = INFO1;
        ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_2c0);
        tVar2 = boost::multiprecision::operator>
                          (in_stack_fffffffffffffc28,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x14b877);
        if (tVar2) {
          local_3b0 = local_238;
        }
        else {
          local_3b0 = local_278;
        }
        local_48 = local_308;
        local_50 = local_3b0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor(in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_backend);
        local_318 = ::soplex::SoPlexBase<double>::realParam(local_78,OPTTOL);
        local_309 = boost::multiprecision::operator<=
                              (in_stack_fffffffffffffc38,(double *)in_stack_fffffffffffffc30);
        pSVar4 = ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        o = ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        _spxout = ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
        local_38 = local_358;
        local_40 = local_308;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)pSVar4,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)o);
        pSVar4 = ::soplex::operator<<(_spxout,in_stack_fffffffffffffc28);
        ::soplex::operator<<(_spxout,(char *)pSVar4);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14b9f2);
        ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_2bc);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x14ba18);
      }
    }
    else if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
            (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
      local_364[2] = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
      local_364[1] = 3;
      ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_364 + 1);
      ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
      ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_364 + 2);
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14bb5e);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14bb6b);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x14bb78);
  }
  else if ((local_78 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
          (VVar3 = ::soplex::SPxOut::getVerbosity(&local_78->spxout), 2 < (int)VVar3)) {
    local_364[0] = ::soplex::SPxOut::getVerbosity(&local_78->spxout);
    local_368 = INFO1;
    ::soplex::SPxOut::setVerbosity(&local_78->spxout,&local_368);
    ::soplex::operator<<(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    ::soplex::SPxOut::setVerbosity(&local_78->spxout,local_364);
  }
  return;
}

Assistant:

static void checkSolutionRational(SoPlexBase<R>& soplex)
{
   if(soplex.hasPrimal())
   {
      Rational boundviol;
      Rational rowviol;
      Rational sumviol;

      if(soplex.getBoundViolationRational(boundviol, sumviol)
            && soplex.getRowViolationRational(rowviol, sumviol))
      {
         SPX_MSG_INFO1(soplex.spxout,
                       Rational maxviol = boundviol > rowviol ? boundviol : rowviol;
                       bool feasible = (maxviol <= soplex.realParam(SoPlexBase<R>::FEASTOL));
                       soplex.spxout << "Primal solution " << (feasible ? "feasible" : "infeasible") <<
                       " in original problem (max. violation = " << maxviol << ").\n"
                      );
      }
      else
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "Could not check primal solution.\n");
      }
   }
   else
   {
      SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal solution available.\n");
   }

   if(soplex.hasDual())
   {
      Rational redcostviol;
      Rational dualviol;
      Rational sumviol;

      if(soplex.getRedCostViolationRational(redcostviol, sumviol)
            && soplex.getDualViolationRational(dualviol, sumviol))
      {
         SPX_MSG_INFO1(soplex.spxout,
                       Rational maxviol = redcostviol > dualviol ? redcostviol : dualviol;
                       bool feasible = (maxviol <= soplex.realParam(SoPlexBase<R>::OPTTOL));
                       soplex.spxout << "Dual solution " << (feasible ? "feasible" : "infeasible") <<
                       " in original problem (max. violation = " << maxviol << ").\n"
                      );
      }
      else
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "Could not check dual solution.\n");
      }
   }
   else
   {
      SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual solution available.\n");
   }
}